

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaFoodWeb_bnd.c
# Opt level: O0

void PrintFinalStats(void *mem)

{
  undefined4 uVar1;
  undefined8 in_RDI;
  int retval;
  long ncfn;
  long netf;
  long nje;
  long nnf;
  long nni;
  long nreLS;
  long nre;
  long nst;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  uVar1 = IDAGetNumSteps(in_RDI,&local_10);
  check_retval(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  uVar1 = IDAGetNumNonlinSolvIters(local_8,&local_28);
  check_retval(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  uVar1 = IDAGetNumResEvals(local_8,&local_18);
  check_retval(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  uVar1 = IDAGetNumErrTestFails(local_8,&local_40);
  check_retval(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  uVar1 = IDAGetNumNonlinSolvConvFails(local_8,&local_30);
  check_retval(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  uVar1 = IDAGetNumStepSolveFails(local_8,&stack0xffffffffffffffb8);
  check_retval(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  uVar1 = IDAGetNumJacEvals(local_8,&local_38);
  check_retval(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  uVar1 = IDAGetNumLinResEvals(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  printf("-----------------------------------------------------------\n");
  printf("Final run statistics: \n\n");
  printf("Number of steps                    = %ld\n",local_10);
  printf("Number of residual evaluations     = %ld\n",local_18 + local_20);
  printf("Number of Jacobian evaluations     = %ld\n",local_38);
  printf("Number of nonlinear iterations     = %ld\n",local_28);
  printf("Number of error test failures      = %ld\n",local_40);
  printf("Number of nonlinear conv. failures = %ld\n",local_30);
  printf("Number of step solver failures     = %ld\n",in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static void PrintFinalStats(void* mem)
{
  long int nst, nre, nreLS, nni, nnf, nje, netf, ncfn;
  int retval;

  retval = IDAGetNumSteps(mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumNonlinSolvIters(mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumResEvals(mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(mem, &nnf);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  retval = IDAGetNumStepSolveFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumStepSolveFails", 1);
  retval = IDAGetNumJacEvals(mem, &nje);
  check_retval(&retval, "IDAGetNumJacEvals", 1);
  retval = IDAGetNumLinResEvals(mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);

  printf("-----------------------------------------------------------\n");
  printf("Final run statistics: \n\n");
  printf("Number of steps                    = %ld\n", nst);
  printf("Number of residual evaluations     = %ld\n", nre + nreLS);
  printf("Number of Jacobian evaluations     = %ld\n", nje);
  printf("Number of nonlinear iterations     = %ld\n", nni);
  printf("Number of error test failures      = %ld\n", netf);
  printf("Number of nonlinear conv. failures = %ld\n", nnf);
  printf("Number of step solver failures     = %ld\n", ncfn);
}